

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_ecmult_target(secp256k1_scalar *target,int mode)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  secp256k1_scratch *psVar4;
  ulong extraout_RAX;
  code *pcVar5;
  long lVar6;
  secp256k1_scalar *psVar7;
  long extraout_RDX;
  ulong uVar8;
  secp256k1_scratch *scratch;
  size_t sVar9;
  secp256k1_gej *r;
  ulong uVar10;
  secp256k1_strauss_point_state *psVar11;
  byte *out32;
  secp256k1_gej *psVar12;
  secp256k1_ge *elem;
  code *cb;
  secp256k1_scalar *cbdata;
  secp256k1_fe *unaff_R12;
  secp256k1_sha256 *hash;
  secp256k1_gej *psVar13;
  secp256k1_ge *unaff_R13;
  secp256k1_scalar *psVar14;
  secp256k1_sha256 *acc;
  secp256k1_gej *psVar15;
  secp256k1_scalar n2;
  secp256k1_scalar n1;
  secp256k1_gej pj;
  secp256k1_gej ptj;
  secp256k1_gej p2j;
  secp256k1_gej p1j;
  secp256k1_ge p;
  secp256k1_fe aux [8];
  secp256k1_ge pre_a [8];
  secp256k1_strauss_point_state ps [1];
  ulong uStack_2070;
  secp256k1_strauss_state sStack_2058;
  secp256k1_fe asStack_2040 [8];
  secp256k1_strauss_point_state sStack_1f00;
  secp256k1_ge asStack_1af0 [8];
  size_t *psStack_1828;
  secp256k1_gej *psStack_1820;
  secp256k1_gej *psStack_1818;
  secp256k1_gej *psStack_1810;
  secp256k1_gej *psStack_1808;
  secp256k1_strauss_point_state *psStack_1800;
  size_t sStack_17e0;
  secp256k1_scalar sStack_17d8;
  secp256k1_scratch asStack_17b8 [2];
  secp256k1_ge sStack_1770;
  secp256k1_gej sStack_1718;
  secp256k1_gej sStack_1698;
  secp256k1_gej sStack_1618;
  secp256k1_gej sStack_1598;
  secp256k1_gej sStack_1518;
  secp256k1_gej asStack_1498 [2];
  secp256k1_gej asStack_1358 [5];
  secp256k1_strauss_point_state sStack_1098;
  secp256k1_gej *psStack_c80;
  secp256k1_sha256 *psStack_c78;
  secp256k1_scratch *psStack_c70;
  secp256k1_sha256 *psStack_c68;
  secp256k1_gej *psStack_c60;
  code *pcStack_c58;
  undefined4 uStack_c4e;
  undefined2 uStack_c4a;
  long lStack_c48;
  byte abStack_c40 [32];
  undefined1 auStack_c20 [40];
  uchar auStack_bf8 [88];
  undefined8 uStack_ba0;
  secp256k1_sha256 sStack_b90;
  secp256k1_gej *psStack_b28;
  secp256k1_fe *psStack_b20;
  secp256k1_ge *psStack_b18;
  secp256k1_ge *psStack_b10;
  secp256k1_gej *psStack_b08;
  secp256k1_strauss_point_state *psStack_b00;
  undefined1 auStack_af8 [32];
  undefined1 local_ad8 [40];
  uint64_t uStack_ab0;
  uint64_t local_aa8;
  uint64_t uStack_aa0;
  uint64_t local_a98;
  uint64_t local_a90;
  uint64_t uStack_a88;
  uint64_t local_a80;
  uint64_t uStack_a78;
  uint64_t local_a70;
  undefined8 local_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 local_a50;
  undefined8 uStack_a48;
  int local_a40;
  secp256k1_strauss_state local_a38;
  secp256k1_gej local_a20;
  secp256k1_gej local_9a0;
  secp256k1_gej local_920;
  secp256k1_ge local_8a0;
  secp256k1_fe local_848 [8];
  secp256k1_ge local_708 [8];
  secp256k1_strauss_point_state local_448;
  
  psVar15 = (secp256k1_gej *)auStack_af8;
  psVar11 = (secp256k1_strauss_point_state *)(ulong)(uint)mode;
  psVar14 = (secp256k1_scalar *)local_ad8;
  psStack_b00 = (secp256k1_strauss_point_state *)0x1642e6;
  random_scalar_order_test(psVar14);
  psStack_b00 = (secp256k1_strauss_point_state *)0x1642f7;
  secp256k1_scalar_add((secp256k1_scalar *)auStack_af8,psVar14,target);
  psStack_b00 = (secp256k1_strauss_point_state *)0x164302;
  secp256k1_scalar_negate((secp256k1_scalar *)auStack_af8,(secp256k1_scalar *)auStack_af8);
  if (mode == 0) {
    psStack_b00 = (secp256k1_strauss_point_state *)0x164457;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_920,(secp256k1_scalar *)local_ad8);
    psStack_b00 = (secp256k1_strauss_point_state *)0x16446e;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_9a0,(secp256k1_scalar *)auStack_af8);
    psStack_b00 = (secp256k1_strauss_point_state *)0x164485;
    secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&local_a20,target);
  }
  else {
    psStack_b00 = (secp256k1_strauss_point_state *)0x16431a;
    random_group_element_test(&local_8a0);
    local_a40 = local_8a0.infinity;
    local_ad8._32_8_ = local_8a0.x.n[0];
    uStack_ab0 = local_8a0.x.n[1];
    local_aa8 = local_8a0.x.n[2];
    uStack_aa0 = local_8a0.x.n[3];
    local_a98 = local_8a0.x.n[4];
    local_a90 = local_8a0.y.n[0];
    uStack_a88 = local_8a0.y.n[1];
    local_a80 = local_8a0.y.n[2];
    uStack_a78 = local_8a0.y.n[3];
    local_a70 = local_8a0.y.n[4];
    local_a68 = 1;
    local_a60 = 0;
    uStack_a58 = 0;
    local_a50 = 0;
    uStack_a48 = 0;
    if (mode == 1) {
      unaff_R12 = local_848;
      unaff_R13 = local_708;
      psVar11 = &local_448;
      psVar14 = &test_ecmult_target::zero;
      psVar15 = (secp256k1_gej *)(local_ad8 + 0x20);
      psStack_b00 = (secp256k1_strauss_point_state *)0x1643dd;
      local_9a0.x.n[0] = (uint64_t)unaff_R12;
      local_9a0.x.n[1] = (uint64_t)unaff_R13;
      local_9a0.x.n[2] = (uint64_t)psVar11;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_9a0,&local_920,1,psVar15,
                 (secp256k1_scalar *)local_ad8,&test_ecmult_target::zero);
      psStack_b00 = (secp256k1_strauss_point_state *)0x16440b;
      local_a20.x.n[0] = (uint64_t)unaff_R12;
      local_a20.x.n[1] = (uint64_t)unaff_R13;
      local_a20.x.n[2] = (uint64_t)psVar11;
      secp256k1_ecmult_strauss_wnaf
                ((secp256k1_strauss_state *)&local_a20,&local_9a0,1,psVar15,
                 (secp256k1_scalar *)auStack_af8,&test_ecmult_target::zero);
      psStack_b00 = (secp256k1_strauss_point_state *)0x164439;
      local_a38.aux = unaff_R12;
      local_a38.pre_a = unaff_R13;
      local_a38.ps = psVar11;
      secp256k1_ecmult_strauss_wnaf
                (&local_a38,&local_a20,1,psVar15,target,&test_ecmult_target::zero);
    }
    else {
      psVar14 = (secp256k1_scalar *)&local_8a0;
      psStack_b00 = (secp256k1_strauss_point_state *)0x1644a4;
      secp256k1_ecmult_const(&local_920,(secp256k1_ge *)psVar14,(secp256k1_scalar *)local_ad8);
      psStack_b00 = (secp256k1_strauss_point_state *)0x1644b7;
      secp256k1_ecmult_const(&local_9a0,(secp256k1_ge *)psVar14,(secp256k1_scalar *)auStack_af8);
      psStack_b00 = (secp256k1_strauss_point_state *)0x1644ca;
      secp256k1_ecmult_const(&local_a20,(secp256k1_ge *)psVar14,target);
      psVar15 = (secp256k1_gej *)auStack_af8;
    }
  }
  psStack_b00 = (secp256k1_strauss_point_state *)0x1644e7;
  secp256k1_gej_add_var(&local_a20,&local_a20,&local_920,(secp256k1_fe *)0x0);
  psStack_b00 = (secp256k1_strauss_point_state *)0x1644fc;
  psVar12 = &local_a20;
  psVar13 = &local_a20;
  secp256k1_gej_add_var(&local_a20,&local_a20,&local_9a0,(secp256k1_fe *)0x0);
  if (local_a20.infinity != 0) {
    return;
  }
  psStack_b00 = (secp256k1_strauss_point_state *)test_ecmult_constants_sha;
  test_ecmult_target_cold_1();
  out32 = (byte *)((ulong)psVar13 & 0xffffffff);
  pcStack_c58 = (code *)0x16454a;
  lStack_c48 = extraout_RDX;
  psStack_b28 = &local_a20;
  psStack_b20 = unaff_R12;
  psStack_b18 = unaff_R13;
  psStack_b10 = (secp256k1_ge *)psVar14;
  psStack_b08 = psVar15;
  psStack_b00 = psVar11;
  psVar4 = secp256k1_scratch_create(&CTX->error_callback,0x10000);
  uStack_c4e = SUB84(psVar13,0);
  acc = &sStack_b90;
  sStack_b90.s[0] = 0x6a09e667;
  sStack_b90.s[1] = 0xbb67ae85;
  sStack_b90.s[2] = 0x3c6ef372;
  sStack_b90.s[3] = 0xa54ff53a;
  sStack_b90.s[4] = 0x510e527f;
  sStack_b90.s[5] = 0x9b05688c;
  sStack_b90.s[6] = 0x1f83d9ab;
  sStack_b90.s[7] = 0x5be0cd19;
  psVar15 = (secp256k1_gej *)0x0;
  sStack_b90.bytes = 0;
  hash = (secp256k1_sha256 *)auStack_c20;
  auStack_c20._0_4_ = 0;
  auStack_c20._4_4_ = 0;
  auStack_c20._8_4_ = 0;
  auStack_c20._12_4_ = 0;
  auStack_c20._16_4_ = 0;
  auStack_c20._20_4_ = 0;
  auStack_c20._24_4_ = 0;
  auStack_c20._28_4_ = 0;
  pcStack_c58 = (code *)0x164597;
  test_ecmult_accumulate(acc,(secp256k1_scalar *)hash,psVar4);
  auStack_c20._0_4_ = 1;
  auStack_c20._4_4_ = 0;
  auStack_c20._8_4_ = 0;
  auStack_c20._12_4_ = 0;
  auStack_c20._16_4_ = 0;
  auStack_c20._20_4_ = 0;
  auStack_c20._24_4_ = 0;
  auStack_c20._28_4_ = 0;
  pcStack_c58 = (code *)0x1645bb;
  test_ecmult_accumulate(acc,(secp256k1_scalar *)hash,psVar4);
  pcStack_c58 = (code *)0x1645c6;
  secp256k1_scalar_negate((secp256k1_scalar *)hash,(secp256k1_scalar *)hash);
  pcStack_c58 = (code *)0x1645d4;
  test_ecmult_accumulate(acc,(secp256k1_scalar *)hash,psVar4);
  if (psVar12 != (secp256k1_gej *)0x0) {
    psVar15 = (secp256k1_gej *)0x0;
    hash = (secp256k1_sha256 *)(auStack_c20 + 0x20);
    out32 = abStack_c40;
    acc = (secp256k1_sha256 *)auStack_c20;
    do {
      uStack_c4a = SUB82(psVar15,0);
      auStack_c20[0x20] = 'g';
      auStack_c20[0x21] = 0xe6;
      auStack_c20[0x22] = '\t';
      auStack_c20[0x23] = 'j';
      auStack_c20[0x24] = 0x85;
      auStack_c20[0x25] = 0xae;
      auStack_c20[0x26] = 'g';
      auStack_c20[0x27] = 0xbb;
      auStack_bf8[0] = 'r';
      auStack_bf8[1] = 0xf3;
      auStack_bf8[2] = 'n';
      auStack_bf8[3] = '<';
      auStack_bf8[4] = ':';
      auStack_bf8[5] = 0xf5;
      auStack_bf8[6] = 'O';
      auStack_bf8[7] = 0xa5;
      auStack_bf8[8] = '\x7f';
      auStack_bf8[9] = 'R';
      auStack_bf8[10] = '\x0e';
      auStack_bf8[0xb] = 'Q';
      auStack_bf8[0xc] = 0x8c;
      auStack_bf8[0xd] = 'h';
      auStack_bf8[0xe] = '\x05';
      auStack_bf8[0xf] = 0x9b;
      auStack_bf8[0x10] = 0xab;
      auStack_bf8[0x11] = 0xd9;
      auStack_bf8[0x12] = 0x83;
      auStack_bf8[0x13] = '\x1f';
      auStack_bf8[0x14] = '\x19';
      auStack_bf8[0x15] = 0xcd;
      auStack_bf8[0x16] = 0xe0;
      auStack_bf8[0x17] = '[';
      uStack_ba0 = 0;
      pcStack_c58 = (code *)0x164625;
      secp256k1_sha256_write(hash,(uchar *)&uStack_c4e,6);
      pcStack_c58 = (code *)0x164630;
      secp256k1_sha256_finalize(hash,out32);
      pcStack_c58 = (code *)0x16463d;
      secp256k1_scalar_set_b32((secp256k1_scalar *)acc,out32,(int *)0x0);
      pcStack_c58 = (code *)0x164650;
      test_ecmult_accumulate(&sStack_b90,(secp256k1_scalar *)acc,psVar4);
      psVar15 = (secp256k1_gej *)((long)(psVar15->x).n + 1);
    } while (psVar12 != psVar15);
  }
  pcStack_c58 = (code *)0x16466a;
  secp256k1_sha256_finalize(&sStack_b90,abStack_c40);
  lVar6 = 0;
  uVar10 = extraout_RAX;
  do {
    uVar8 = uVar10 & 0xffffffff;
    bVar1 = abStack_c40[lVar6];
    psVar14 = (secp256k1_scalar *)(ulong)bVar1;
    bVar2 = *(byte *)(lStack_c48 + lVar6);
    psVar13 = (secp256k1_gej *)(ulong)bVar2;
    uVar10 = (ulong)((uint)bVar1 - (uint)bVar2);
    if (bVar1 == bVar2) {
      uVar10 = uVar8;
    }
    iVar3 = (int)uVar10;
    if (bVar1 != bVar2) goto LAB_00164694;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x20);
  iVar3 = 0;
LAB_00164694:
  if (iVar3 == 0) {
    pcStack_c58 = (code *)0x1646ac;
    secp256k1_scratch_destroy(&CTX->error_callback,psVar4);
    return;
  }
  pcStack_c58 = test_ecmult_accumulate;
  test_ecmult_constants_sha_cold_1();
  sStack_17d8.d[2] = 0;
  sStack_17d8.d[3] = 0;
  sStack_17d8.d[0] = 0;
  sStack_17d8.d[1] = 0;
  sStack_17e0 = 0x41;
  sStack_1518.infinity = 0;
  sStack_1518.x.n[0] = 0x2815b16f81798;
  sStack_1518.x.n[1] = 0xdb2dce28d959f;
  sStack_1518.x.n[2] = 0xe870b07029bfc;
  sStack_1518.x.n[3] = 0xbbac55a06295c;
  sStack_1518.x.n[4] = 0x79be667ef9dc;
  sStack_1518.y.n[4] = 0x483ada7726a3;
  sStack_1518.y.n[0] = 0x7d08ffb10d4b8;
  sStack_1518.y.n[1] = 0x48a68554199c4;
  sStack_1518.y.n[2] = 0xe1108a8fd17b4;
  sStack_1518.y.n[3] = 0xc4655da4fbfc0;
  sStack_1518.z.n[0] = 1;
  sStack_1518.z.n[3] = 0;
  sStack_1518.z.n[4] = 0;
  sStack_1518.z.n[1] = 0;
  sStack_1518.z.n[2] = 0;
  sStack_1598.infinity = 1;
  sStack_1598.z.n[4] = 0;
  sStack_1598.z.n[2] = 0;
  sStack_1598.z.n[3] = 0;
  sStack_1598.z.n[0] = 0;
  sStack_1598.z.n[1] = 0;
  sStack_1598.y.n[3] = 0;
  sStack_1598.y.n[4] = 0;
  sStack_1598.y.n[1] = 0;
  sStack_1598.y.n[2] = 0;
  sStack_1598.x.n[4] = 0;
  sStack_1598.y.n[0] = 0;
  sStack_1598.x.n[2] = 0;
  sStack_1598.x.n[3] = 0;
  sStack_1598.x.n[0] = 0;
  sStack_1598.x.n[1] = 0;
  psStack_1800 = (secp256k1_strauss_point_state *)0x1647a8;
  psStack_c80 = psVar15;
  psStack_c78 = hash;
  psStack_c70 = psVar4;
  psStack_c68 = acc;
  psStack_c60 = psVar12;
  pcStack_c58 = (code *)out32;
  secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx,&sStack_1618,psVar14);
  psStack_1800 = (secp256k1_strauss_point_state *)0x1647f3;
  sStack_1718.x.n[0] = (uint64_t)asStack_1498;
  sStack_1718.x.n[1] = (uint64_t)asStack_1358;
  sStack_1718.x.n[2] = (uint64_t)&sStack_1098;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1718,&sStack_1698,1,&sStack_1518,psVar14,
             &sStack_17d8);
  psStack_1800 = (secp256k1_strauss_point_state *)0x164824;
  sStack_1770.x.n[0] = (uint64_t)asStack_1498;
  sStack_1770.x.n[1] = (uint64_t)asStack_1358;
  sStack_1770.x.n[2] = (uint64_t)&sStack_1098;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_1770,&sStack_1718,1,&sStack_1598,&sStack_17d8,
             psVar14);
  psStack_1800 = (secp256k1_strauss_point_state *)0x16484d;
  secp256k1_ecmult_multi_var
            ((secp256k1_callback *)0x0,scratch,(secp256k1_gej *)&sStack_1098,psVar14,
             (secp256k1_ecmult_multi_callback *)0x0,(void *)0x0,0);
  cb = test_ecmult_accumulate_cb;
  psStack_1800 = (secp256k1_strauss_point_state *)0x164878;
  cbdata = psVar14;
  secp256k1_ecmult_multi_var
            ((secp256k1_callback *)0x0,scratch,asStack_1358,&sStack_17d8,test_ecmult_accumulate_cb,
             psVar14,1);
  psVar15 = asStack_1498;
  psStack_1800 = (secp256k1_strauss_point_state *)0x164892;
  secp256k1_ecmult_const(psVar15,&secp256k1_ge_const_g,psVar14);
  psStack_1800 = (secp256k1_strauss_point_state *)0x1648aa;
  secp256k1_ge_set_gej_var(&sStack_1770,&sStack_1618);
  psStack_1800 = (secp256k1_strauss_point_state *)0x1648ba;
  ge_equals_gej(&sStack_1770,&sStack_1698);
  psStack_1800 = (secp256k1_strauss_point_state *)0x1648c5;
  ge_equals_gej(&sStack_1770,&sStack_1718);
  psStack_1800 = (secp256k1_strauss_point_state *)0x1648d0;
  ge_equals_gej(&sStack_1770,(secp256k1_gej *)&sStack_1098);
  psStack_1800 = (secp256k1_strauss_point_state *)0x1648db;
  ge_equals_gej(&sStack_1770,asStack_1358);
  psStack_1800 = (secp256k1_strauss_point_state *)0x1648e6;
  ge_equals_gej(&sStack_1770,psVar15);
  if (sStack_1770.infinity == 0) {
    elem = &sStack_1770;
    psVar4 = asStack_17b8;
    psVar14 = (secp256k1_scalar *)0x0;
    psStack_1800 = (secp256k1_strauss_point_state *)0x164922;
    secp256k1_eckey_pubkey_serialize(elem,psVar4->magic,&sStack_17e0,0);
    if (sStack_17e0 != 0x41) {
      psStack_1800 = (secp256k1_strauss_point_state *)secp256k1_ecmult_multi_var;
      test_ecmult_accumulate_cold_1();
      r->infinity = 1;
      (r->x).n[0] = 0;
      (r->x).n[1] = 0;
      (r->x).n[2] = 0;
      (r->x).n[3] = 0;
      (r->x).n[4] = 0;
      (r->y).n[0] = 0;
      (r->y).n[1] = 0;
      (r->y).n[2] = 0;
      (r->y).n[3] = 0;
      (r->y).n[4] = 0;
      (r->z).n[0] = 0;
      (r->z).n[1] = 0;
      (r->z).n[2] = 0;
      (r->z).n[3] = 0;
      (r->z).n[4] = 0;
      if (psVar14 != (secp256k1_scalar *)0x0 || psVar13 != (secp256k1_gej *)0x0) {
        psStack_1828 = &sStack_17e0;
        psStack_1820 = &sStack_1718;
        psStack_1818 = asStack_1358;
        psStack_1810 = psVar13;
        psStack_1808 = psVar15;
        psStack_1800 = &sStack_1098;
        if (psVar13 != (secp256k1_gej *)0x0) {
          if (psVar4 != (secp256k1_scratch *)0x0) {
            sVar9 = secp256k1_pippenger_max_points((secp256k1_callback *)elem,psVar4);
            if (sVar9 != 0) {
              uVar10 = 5000000;
              if (sVar9 < 5000000) {
                uVar10 = sVar9;
              }
              uStack_2070 = (ulong)&psVar13[-1].field_0x7f / uVar10 + 1;
              psVar15 = (secp256k1_gej *)((ulong)&psVar13[-1].field_0x7f / uStack_2070 + 1);
            }
            if (sVar9 != 0) {
              if (psVar15 < (secp256k1_gej *)0x58) {
                sVar9 = secp256k1_scratch_max_allocation((secp256k1_callback *)elem,psVar4,5);
                if (0x8af < sVar9) {
                  uVar10 = sVar9 / 0x8b0;
                  if (4999999 < uVar10) {
                    uVar10 = 5000000;
                  }
                  uStack_2070 = (ulong)&psVar13[-1].field_0x7f / uVar10 + 1;
                  psVar15 = (secp256k1_gej *)((ulong)&psVar13[-1].field_0x7f / uStack_2070 + 1);
                }
                if (sVar9 < 0x8b0) goto LAB_00164b07;
                pcVar5 = secp256k1_ecmult_strauss_batch;
              }
              else {
                pcVar5 = secp256k1_ecmult_pippenger_batch;
              }
              lVar6 = 0;
              uVar10 = 0;
              while( true ) {
                psVar12 = psVar15;
                if (psVar13 < psVar15) {
                  psVar12 = psVar13;
                }
                psVar7 = (secp256k1_scalar *)0x0;
                if (uVar10 == 0) {
                  psVar7 = psVar14;
                }
                iVar3 = (*pcVar5)(elem,psVar4,&sStack_1f00,psVar7,cb,cbdata,psVar12,lVar6);
                if (iVar3 == 0) break;
                secp256k1_gej_add_var(r,r,(secp256k1_gej *)&sStack_1f00,(secp256k1_fe *)0x0);
                psVar13 = (secp256k1_gej *)((long)psVar13 - (long)psVar12);
                uVar10 = uVar10 + 1;
                lVar6 = (long)(psVar15->x).n + lVar6;
                if (uStack_2070 == uVar10) {
                  return;
                }
              }
              return;
            }
          }
LAB_00164b07:
          secp256k1_ecmult_multi_simple_var(r,psVar14,cb,cbdata,(size_t)psVar13);
          return;
        }
        sStack_2058.aux = asStack_2040;
        sStack_2058.pre_a = asStack_1af0;
        sStack_2058.ps = &sStack_1f00;
        secp256k1_ecmult_strauss_wnaf(&sStack_2058,r,1,r,&secp256k1_scalar_zero,psVar14);
      }
      return;
    }
    sVar9 = 0x41;
  }
  else {
    asStack_17b8[0].magic[0] = '\0';
    sVar9 = 1;
  }
  psStack_1800 = (secp256k1_strauss_point_state *)0x164938;
  secp256k1_sha256_write((secp256k1_sha256 *)psVar13,asStack_17b8[0].magic,sVar9);
  return;
}

Assistant:

static void test_ecmult_target(const secp256k1_scalar* target, int mode) {
    /* Mode: 0=ecmult_gen, 1=ecmult, 2=ecmult_const */
    secp256k1_scalar n1, n2;
    secp256k1_ge p;
    secp256k1_gej pj, p1j, p2j, ptj;
    static const secp256k1_scalar zero = SECP256K1_SCALAR_CONST(0, 0, 0, 0, 0, 0, 0, 0);

    /* Generate random n1,n2 such that n1+n2 = -target. */
    random_scalar_order_test(&n1);
    secp256k1_scalar_add(&n2, &n1, target);
    secp256k1_scalar_negate(&n2, &n2);

    /* Generate a random input point. */
    if (mode != 0) {
        random_group_element_test(&p);
        secp256k1_gej_set_ge(&pj, &p);
    }

    /* EC multiplications */
    if (mode == 0) {
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &p1j, &n1);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &p2j, &n2);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &ptj, target);
    } else if (mode == 1) {
        secp256k1_ecmult(&p1j, &pj, &n1, &zero);
        secp256k1_ecmult(&p2j, &pj, &n2, &zero);
        secp256k1_ecmult(&ptj, &pj, target, &zero);
    } else {
        secp256k1_ecmult_const(&p1j, &p, &n1);
        secp256k1_ecmult_const(&p2j, &p, &n2);
        secp256k1_ecmult_const(&ptj, &p, target);
    }

    /* Add them all up: n1*P + n2*P + target*P = (n1+n2+target)*P = (n1+n1-n1-n2)*P = 0. */
    secp256k1_gej_add_var(&ptj, &ptj, &p1j, NULL);
    secp256k1_gej_add_var(&ptj, &ptj, &p2j, NULL);
    CHECK(secp256k1_gej_is_infinity(&ptj));
}